

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O1

void Omega_h::vtk::read_pvd
               (istream *stream,vector<double,_std::allocator<double>_> *times_out,
               vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>
               *pvtupaths_out)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  _Rb_tree_header *p_Var2;
  char *__nptr;
  double dVar3;
  char cVar4;
  bool bVar5;
  int iVar6;
  istream *piVar7;
  mapped_type *pmVar8;
  int *piVar9;
  undefined8 uVar10;
  vector<double,_std::allocator<double>_> times;
  string line;
  vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> pvtupaths;
  Tag tag;
  key_type local_138;
  vector<double,_std::allocator<double>_> local_118;
  key_type local_100;
  string local_e0;
  vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> *local_c0;
  vector<double,_std::allocator<double>_> *local_b8;
  double local_b0;
  vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_> local_a8;
  Tag local_88;
  
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (double *)0x0;
  local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (double *)0x0;
  local_a8.super__Vector_base<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_a8.super__Vector_base<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.super__Vector_base<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_e0._M_dataplus._M_p = (pointer)&local_e0.field_2;
  local_e0._M_string_length = 0;
  local_e0.field_2._M_local_buf[0] = '\0';
  paVar1 = &local_88.elem_name.field_2;
  p_Var2 = &local_88.attribs._M_t._M_impl.super__Rb_tree_header;
  local_c0 = pvtupaths_out;
  local_b8 = times_out;
  do {
    cVar4 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + (char)stream);
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (stream,(string *)&local_e0,cVar4);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e0._M_dataplus._M_p != &local_e0.field_2) {
        operator_delete(local_e0._M_dataplus._M_p,
                        CONCAT71(local_e0.field_2._M_allocated_capacity._1_7_,
                                 local_e0.field_2._M_local_buf[0]) + 1);
      }
      std::vector<double,_std::allocator<double>_>::operator=(local_b8,&local_118);
      std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::operator=
                (local_c0,&local_a8);
      std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::~vector
                (&local_a8);
      if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      return;
    }
    local_88.elem_name._M_string_length = 0;
    local_88.elem_name.field_2._M_local_buf[0] = '\0';
    local_88.attribs._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_88.attribs._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_88.attribs._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    local_88.elem_name._M_dataplus._M_p = (pointer)paVar1;
    local_88.attribs._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var2->_M_header;
    local_88.attribs._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var2->_M_header;
    bVar5 = xml_lite::parse_tag(&local_e0,&local_88);
    if ((bVar5) && (iVar6 = std::__cxx11::string::compare((char *)&local_88), iVar6 == 0)) {
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"timestep","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_88.attribs,&local_138);
      __nptr = (pmVar8->_M_dataplus)._M_p;
      piVar9 = __errno_location();
      iVar6 = *piVar9;
      *piVar9 = 0;
      dVar3 = strtod(__nptr,(char **)&local_100);
      if (local_100._M_dataplus._M_p == __nptr) {
        std::__throw_invalid_argument("stod");
LAB_00427d0b:
        uVar10 = std::__throw_out_of_range("stod");
        std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::~vector
                  (&local_a8);
        if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (long)local_118.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_118.super__Vector_base<double,_std::allocator<double>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        _Unwind_Resume(uVar10);
      }
      if (*piVar9 == 0) {
        *piVar9 = iVar6;
      }
      else if (*piVar9 == 0x22) goto LAB_00427d0b;
      local_b0 = dVar3;
      if (local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_finish ==
          local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                  (&local_118,
                   (iterator)
                   local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_finish,&local_b0);
      }
      else {
        *local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
         super__Vector_impl_data._M_finish = dVar3;
        local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_finish =
             local_118.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish + 1;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"file","");
      pmVar8 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&local_88.attribs,&local_100);
      filesystem::path::path((path *)&local_138,pmVar8);
      std::vector<Omega_h::filesystem::path,_std::allocator<Omega_h::filesystem::path>_>::
      emplace_back<Omega_h::filesystem::path>(&local_a8,(path *)&local_138);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_138._M_dataplus._M_p != &local_138.field_2) {
        operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_100._M_dataplus._M_p != &local_100.field_2) {
        operator_delete(local_100._M_dataplus._M_p,local_100.field_2._M_allocated_capacity + 1);
      }
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree(&local_88.attribs._M_t);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88.elem_name._M_dataplus._M_p != paVar1) {
      operator_delete(local_88.elem_name._M_dataplus._M_p,
                      CONCAT71(local_88.elem_name.field_2._M_allocated_capacity._1_7_,
                               local_88.elem_name.field_2._M_local_buf[0]) + 1);
    }
  } while( true );
}

Assistant:

void read_pvd(std::istream& stream, std::vector<Real>* times_out,
    std::vector<filesystem::path>* pvtupaths_out) {
  std::vector<Real> times;
  std::vector<filesystem::path> pvtupaths;
  for (std::string line; std::getline(stream, line);) {
    xml_lite::Tag tag;
    if (!xml_lite::parse_tag(line, &tag)) continue;
    if (tag.elem_name != "DataSet") continue;
    times.push_back(std::stod(tag.attribs["timestep"]));
    pvtupaths.push_back(tag.attribs["file"]);
  }
  *times_out = times;
  *pvtupaths_out = pvtupaths;
}